

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

Flag __thiscall
Js::ConfigFlagsTable::GetNextChildFlag(ConfigFlagsTable *this,Flag parentFlag,Flag currentChildFlag)

{
  Flag FVar1;
  int local_24;
  Flag parentFlagForCurrentFlag;
  Flag currentFlag;
  int i;
  int startIndex;
  Flag currentChildFlag_local;
  Flag parentFlag_local;
  ConfigFlagsTable *this_local;
  
  _parentFlagForCurrentFlag = currentChildFlag + 1;
  if ((currentChildFlag == InvalidFlag) || (currentChildFlag == FlagMax)) {
    _parentFlagForCurrentFlag = 0;
  }
  local_24 = _parentFlagForCurrentFlag;
  while( true ) {
    if (0x1d5 < local_24) {
      return InvalidFlag;
    }
    FVar1 = GetParentFlag(this,(Flag)local_24);
    if (FVar1 == parentFlag) break;
    local_24 = local_24 + 1;
  }
  return (Flag)local_24;
}

Assistant:

Flag
    ConfigFlagsTable::GetNextChildFlag(Flag parentFlag, Flag currentChildFlag)  const
    {
        // start at the current+1
        int startIndex = (int)currentChildFlag + 1;

        // otherwise start from beginning
        if (currentChildFlag == InvalidFlag || currentChildFlag == NoParentFlag)
        {
            // reset the start index
            startIndex = 0;
        }

        for(int i=startIndex; i < FlagCount; i++)
        {
            Flag currentFlag = (Flag)i;
            Flag parentFlagForCurrentFlag = GetParentFlag(currentFlag);

            if(parentFlagForCurrentFlag == parentFlag)
            {
                // found a match
                return currentFlag;
            }
        }

        // no more
        return InvalidFlag;
    }